

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O0

void Gia_ObjComputeTruthTable6Lut_rec(Gia_Man_t *p,int iObj,Vec_Wrd_t *vTemp)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  ulong local_68;
  ulong local_58;
  Gia_Obj_t *pObj;
  word uTruth1;
  word uTruth0;
  Vec_Wrd_t *vTemp_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  pObj_00 = Gia_ManObj(p,iObj);
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,iObj);
    iVar1 = Gia_ObjIsAnd(pObj_00);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                    ,0x12d,"void Gia_ObjComputeTruthTable6Lut_rec(Gia_Man_t *, int, Vec_Wrd_t *)");
    }
    iVar1 = Gia_ObjFaninId0p(p,pObj_00);
    Gia_ObjComputeTruthTable6Lut_rec(p,iVar1,vTemp);
    iVar1 = Gia_ObjFaninId1p(p,pObj_00);
    Gia_ObjComputeTruthTable6Lut_rec(p,iVar1,vTemp);
    iVar1 = Gia_ObjFaninId0p(p,pObj_00);
    local_58 = Vec_WrdEntry(vTemp,iVar1);
    iVar1 = Gia_ObjFaninC0(pObj_00);
    if (iVar1 != 0) {
      local_58 = local_58 ^ 0xffffffffffffffff;
    }
    iVar1 = Gia_ObjFaninId1p(p,pObj_00);
    local_68 = Vec_WrdEntry(vTemp,iVar1);
    iVar1 = Gia_ObjFaninC1(pObj_00);
    if (iVar1 != 0) {
      local_68 = local_68 ^ 0xffffffffffffffff;
    }
    Vec_WrdWriteEntry(vTemp,iObj,local_58 & local_68);
  }
  return;
}

Assistant:

void Gia_ObjComputeTruthTable6Lut_rec( Gia_Man_t * p, int iObj, Vec_Wrd_t * vTemp )
{
    word uTruth0, uTruth1;
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ObjComputeTruthTable6Lut_rec( p, Gia_ObjFaninId0p(p, pObj), vTemp );
    Gia_ObjComputeTruthTable6Lut_rec( p, Gia_ObjFaninId1p(p, pObj), vTemp );
    uTruth0 = Vec_WrdEntry( vTemp, Gia_ObjFaninId0p(p, pObj) );
    uTruth0 = Gia_ObjFaninC0(pObj) ? ~uTruth0 : uTruth0;
    uTruth1 = Vec_WrdEntry( vTemp, Gia_ObjFaninId1p(p, pObj) );
    uTruth1 = Gia_ObjFaninC1(pObj) ? ~uTruth1 : uTruth1;
    Vec_WrdWriteEntry( vTemp, iObj, uTruth0 & uTruth1 );
}